

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterTests.cpp
# Opt level: O1

void addLearningRate<CoreML::Specification::NeuralNetworkClassifier>
               (NeuralNetworkClassifier *nn,OptimizerTypeCase optimizerType,double defaultValue,
               double minValue,double maxValue)

{
  NetworkUpdateParameters *pNVar1;
  Optimizer *pOVar2;
  SGDOptimizer *this;
  DoubleParameter *pDVar3;
  AdamOptimizer *this_00;
  DoubleRange *pDVar4;
  DoubleParameter **ppDVar5;
  
  if (nn->updateparams_ == (NetworkUpdateParameters *)0x0) {
    pNVar1 = (NetworkUpdateParameters *)operator_new(0x50);
    CoreML::Specification::NetworkUpdateParameters::NetworkUpdateParameters(pNVar1);
    nn->updateparams_ = pNVar1;
  }
  pNVar1 = nn->updateparams_;
  if (pNVar1->optimizer_ == (Optimizer *)0x0) {
    pOVar2 = (Optimizer *)operator_new(0x20);
    CoreML::Specification::Optimizer::Optimizer(pOVar2);
    pNVar1->optimizer_ = pOVar2;
  }
  pOVar2 = pNVar1->optimizer_;
  if (optimizerType == kAdamOptimizer) {
    if (pOVar2->_oneof_case_[0] != 0xb) {
      CoreML::Specification::Optimizer::clear_OptimizerType(pOVar2);
      pOVar2->_oneof_case_[0] = 0xb;
      this_00 = (AdamOptimizer *)operator_new(0x40);
      CoreML::Specification::AdamOptimizer::AdamOptimizer(this_00);
      (pOVar2->OptimizerType_).adamoptimizer_ = this_00;
    }
    ppDVar5 = &((pOVar2->OptimizerType_).sgdoptimizer_)->learningrate_;
    if (((pOVar2->OptimizerType_).sgdoptimizer_)->learningrate_ == (DoubleParameter *)0x0) {
      pDVar3 = (DoubleParameter *)operator_new(0x28);
      CoreML::Specification::DoubleParameter::DoubleParameter(pDVar3);
LAB_001a6971:
      *ppDVar5 = pDVar3;
    }
  }
  else {
    if (optimizerType != kSgdOptimizer) {
      pDVar3 = (DoubleParameter *)0x0;
      goto LAB_001a697b;
    }
    if (pOVar2->_oneof_case_[0] != 10) {
      CoreML::Specification::Optimizer::clear_OptimizerType(pOVar2);
      pOVar2->_oneof_case_[0] = 10;
      this = (SGDOptimizer *)operator_new(0x30);
      CoreML::Specification::SGDOptimizer::SGDOptimizer(this);
      (pOVar2->OptimizerType_).sgdoptimizer_ = this;
    }
    ppDVar5 = &((pOVar2->OptimizerType_).sgdoptimizer_)->learningrate_;
    if (((pOVar2->OptimizerType_).sgdoptimizer_)->learningrate_ == (DoubleParameter *)0x0) {
      pDVar3 = (DoubleParameter *)operator_new(0x28);
      CoreML::Specification::DoubleParameter::DoubleParameter(pDVar3);
      goto LAB_001a6971;
    }
  }
  pDVar3 = *ppDVar5;
LAB_001a697b:
  pDVar3->defaultvalue_ = defaultValue;
  if (pDVar3->_oneof_case_[0] != 10) {
    CoreML::Specification::DoubleParameter::clear_AllowedValues(pDVar3);
    pDVar3->_oneof_case_[0] = 10;
    pDVar4 = (DoubleRange *)operator_new(0x28);
    CoreML::Specification::DoubleRange::DoubleRange(pDVar4);
    (pDVar3->AllowedValues_).range_ = pDVar4;
  }
  pDVar4 = (pDVar3->AllowedValues_).range_;
  pDVar4->minvalue_ = minValue;
  pDVar4->maxvalue_ = maxValue;
  return;
}

Assistant:

void addLearningRate(NeuralNetworkClass *nn, Specification::Optimizer::OptimizerTypeCase optimizerType, double defaultValue, double minValue,  double maxValue) {
    
    auto updateParameters = nn->mutable_updateparams();
    auto optimizer = updateParameters->mutable_optimizer();

    Specification::DoubleParameter *learningRate = NULL;
    
    switch (optimizerType) {
        case Specification::Optimizer::kSgdOptimizer:
            learningRate = optimizer->mutable_sgdoptimizer()->mutable_learningrate();
            break;
        case Specification::Optimizer::kAdamOptimizer:
            learningRate = optimizer->mutable_adamoptimizer()->mutable_learningrate();
            break;
        default:
            break;
    }
    
    learningRate->set_defaultvalue(defaultValue);
    
    auto doubleRange = learningRate->mutable_range();
    doubleRange->set_minvalue(minValue);
    doubleRange->set_maxvalue(maxValue);
}